

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O0

leb_SameDepthNeighborIDs leb__SplitNodeIDs(leb_SameDepthNeighborIDs nodeIDs,uint32_t splitBit)

{
  leb_SameDepthNeighborIDs lVar1;
  uint32_t b3;
  uint32_t b2;
  uint32_t n4;
  uint32_t n3;
  uint32_t n2;
  uint32_t n1;
  uint32_t splitBit_local;
  leb_SameDepthNeighborIDs nodeIDs_local;
  uint local_10;
  uint uStack_c;
  
  n1 = nodeIDs.left;
  splitBit_local = nodeIDs.right;
  nodeIDs_local.left = nodeIDs.edge;
  nodeIDs_local.right = nodeIDs._reserved;
  if (splitBit == 0) {
    nodeIDs_local.edge = nodeIDs_local.right << 1 | 1;
    nodeIDs_local._reserved = nodeIDs_local.left << 1 | (uint)(nodeIDs_local.left != 0);
    local_10 = splitBit_local << 1 | (uint)(splitBit_local != 0);
    uStack_c = nodeIDs_local.right << 1;
  }
  else {
    nodeIDs_local.edge = nodeIDs_local.left << 1;
    nodeIDs_local._reserved = nodeIDs_local.right << 1;
    local_10 = n1 << 1;
    uStack_c = nodeIDs_local.right << 1 | 1;
  }
  lVar1.right = nodeIDs_local._reserved;
  lVar1.left = nodeIDs_local.edge;
  lVar1.edge = local_10;
  lVar1._reserved = uStack_c;
  return lVar1;
}

Assistant:

static leb_SameDepthNeighborIDs
leb__SplitNodeIDs(
    const leb_SameDepthNeighborIDs nodeIDs,
    const uint32_t splitBit
) {
    uint32_t n1 = nodeIDs.left, n2 = nodeIDs.right,
             n3 = nodeIDs.edge, n4 = nodeIDs._reserved;
    uint32_t b2 = (n2 == 0u) ? 0u : 1u,
             b3 = (n3 == 0u) ? 0u : 1u;

    if (splitBit == 0u) {
        return {n4 << 1 | 1, n3 << 1 | b3, n2 << 1 | b2, n4 << 1    };
    } else {
        return {n3 << 1    , n4 << 1     , n1 << 1     , n4 << 1 | 1};
    }
}